

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  uint uVar1;
  uint c;
  unsigned_short local_2e;
  uint local_2c;
  
  for (; *utf8_chars != '\0'; utf8_chars = utf8_chars + uVar1) {
    local_2c = 0;
    uVar1 = ImTextCharFromUtf8(&local_2c,utf8_chars,(char *)0x0);
    if (local_2c - 1 < 0xffff) {
      local_2e = (unsigned_short)local_2c;
      ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_2e);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    while (*utf8_chars != 0)
    {
        unsigned int c = 0;
        utf8_chars += ImTextCharFromUtf8(&c, utf8_chars, NULL);
        if (c > 0 && c <= IM_UNICODE_CODEPOINT_MAX)
            InputQueueCharacters.push_back((ImWchar)c);
    }
}